

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_next(LexState *ls)

{
  LexToken LVar1;
  long in_RDI;
  TValue *in_stack_00000068;
  LexState *in_stack_00000070;
  
  *(undefined4 *)(in_RDI + 100) = *(undefined4 *)(in_RDI + 0x60);
  if (*(int *)(in_RDI + 0x38) == 0x121) {
    LVar1 = lex_scan(in_stack_00000070,in_stack_00000068);
    *(LexToken *)(in_RDI + 0x34) = LVar1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x38);
    *(undefined4 *)(in_RDI + 0x38) = 0x121;
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x18);
  }
  return;
}

Assistant:

void lj_lex_next(LexState *ls)
{
  ls->lastline = ls->linenumber;
  if (LJ_LIKELY(ls->lookahead == TK_eof)) {  /* No lookahead token? */
    ls->tok = lex_scan(ls, &ls->tokval);  /* Get next token. */
  } else {  /* Otherwise return lookahead token. */
    ls->tok = ls->lookahead;
    ls->lookahead = TK_eof;
    ls->tokval = ls->lookaheadval;
  }
}